

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int CmdCommandHistory(Abc_Frame_t *pAbc,int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  void *pvVar2;
  int local_3c;
  int nPrints;
  int c;
  int i;
  char *pName;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_3c = 0x14;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (argc <= globalUtilOptind + 1)) {
    if (argc == globalUtilOptind + 1) {
      local_3c = atoi(argv[globalUtilOptind]);
    }
    iVar1 = Vec_PtrSize(pAbc->aHistory);
    for (nPrints = Abc_MaxInt(0,iVar1 - local_3c); iVar1 = Vec_PtrSize(pAbc->aHistory),
        nPrints < iVar1; nPrints = nPrints + 1) {
      pvVar2 = Vec_PtrEntry(pAbc->aHistory,nPrints);
      __stream = (FILE *)pAbc->Out;
      iVar1 = Vec_PtrSize(pAbc->aHistory);
      fprintf(__stream,"%2d : %s\n",(ulong)(uint)(iVar1 - nPrints),pvVar2);
    }
    pAbc_local._4_4_ = 0;
  }
  else {
    fprintf((FILE *)pAbc->Err,"usage: history [-h] <num>\n");
    fprintf((FILE *)pAbc->Err,"\t        lists the last commands entered on the command line\n");
    fprintf((FILE *)pAbc->Err,"\t-h    : print the command usage\n");
    fprintf((FILE *)pAbc->Err,"\t<num> : the maximum number of entries to show [default = %d]\n",
            0x14);
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int CmdCommandHistory( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pName;
    int i, c;
    int nPrints = 20;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default :
                goto usage;
        }
    }
    if ( argc > globalUtilOptind + 1 )
        goto usage;
    // get the number from the command line
    if ( argc == globalUtilOptind + 1 )
        nPrints = atoi(argv[globalUtilOptind]);
    // print the commands
    Vec_PtrForEachEntryStart( char *, pAbc->aHistory, pName, i, Abc_MaxInt(0, Vec_PtrSize(pAbc->aHistory)-nPrints) )
        fprintf( pAbc->Out, "%2d : %s\n", Vec_PtrSize(pAbc->aHistory)-i, pName );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: history [-h] <num>\n" );
    fprintf( pAbc->Err, "\t        lists the last commands entered on the command line\n" );
    fprintf( pAbc->Err, "\t-h    : print the command usage\n" );
    fprintf( pAbc->Err, "\t<num> : the maximum number of entries to show [default = %d]\n", nPrints );
    return ( 1 );
}